

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Csv.cpp
# Opt level: O1

size_t __thiscall CASC_CSV::LoadHeader(CASC_CSV *this,void *pvListFile)

{
  size_t sVar1;
  char *szLineEnd;
  char *szLineBegin;
  char *local_28;
  char *local_20;
  
  ListFile_GetNextLine(pvListFile,&local_20,&local_28);
  if (local_20 < local_28) {
    sVar1 = LoadElements(this,this->Headers,0x10,local_20,local_28);
  }
  else {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

size_t CASC_CSV::LoadHeader(void * pvListFile)
{
    const char * szLineBegin;
    const char * szLineEnd;
    size_t nCount = 0;

    ListFile_GetNextLine(pvListFile, &szLineBegin, &szLineEnd);
    if (szLineBegin < szLineEnd)
    {
        nCount = LoadHeader(szLineBegin, szLineEnd);
    }

    return nCount;
}